

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

iter_result * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::last(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this)

{
  undefined1 uVar1;
  ulong uVar2;
  ulong extraout_RAX;
  iter_result *in_RDI;
  bool bVar3;
  
  uVar2 = 0xff;
  do {
    if ((this->child_indexes)._M_elems[uVar2 & 0xff].value != 0xff) goto LAB_00132a7c;
    bVar3 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar3);
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
  ::last();
  uVar2 = extraout_RAX;
LAB_00132a7c:
  (in_RDI->node).tagged_ptr = (ulong)this | 3;
  in_RDI->key_byte = (byte)uVar2;
  in_RDI->child_index = (byte)uVar2;
  uVar1 = this->field_0x7;
  *(key_prefix_data *)&in_RDI->prefix = (key_prefix_data)*(undefined7 *)&this->field_0x0;
  *(undefined1 *)((long)&in_RDI->prefix + 7) = uVar1;
  return in_RDI;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result
  last() noexcept {
    for (std::int64_t i = 255; i >= 0; i--) {
      if (child_indexes[static_cast<std::uint8_t>(i)] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I48}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 17 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }